

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_short,_short,_char_*> *
__thiscall
fmt::v9::
make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,short&,short&,char*&>
          (format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_short,_short,_char_*>
           *__return_storage_ptr__,v9 *this,short *args,short *args_1,char **args_2)

{
  longlong lVar1;
  bool formattable_2;
  bool formattable_pointer_2;
  bool formattable_const_2;
  bool formattable_char_2;
  char_type **arg_2;
  bool formattable;
  bool formattable_pointer;
  bool formattable_const;
  bool formattable_char;
  int *arg;
  bool formattable_1;
  bool formattable_pointer_1;
  bool formattable_const_1;
  bool formattable_char_1;
  int *arg_1;
  size_t local_130;
  longlong local_a8;
  size_t local_a0;
  char **args_local_2;
  short *args_local_1;
  short *args_local;
  size_t local_60;
  
  local_a8._0_4_ = (int)*(short *)this;
  args_local._0_4_ = (int)*args;
  lVar1 = *(longlong *)args_1;
  (__return_storage_ptr__->data_).args_[0].field_0.long_long_value = local_a8;
  (__return_storage_ptr__->data_).args_[0].field_0.string.size = local_a0;
  (__return_storage_ptr__->data_).args_[1].field_0.string.data = (char *)args_local;
  (__return_storage_ptr__->data_).args_[1].field_0.string.size = local_60;
  (__return_storage_ptr__->data_).args_[2].field_0.long_long_value = lVar1;
  (__return_storage_ptr__->data_).args_[2].field_0.string.size = local_130;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto make_format_args(Args&&... args)
    -> format_arg_store<Context, remove_cvref_t<Args>...> {
  return {FMT_FORWARD(args)...};
}